

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

bool __thiscall common::Config::GetHost(Config *this,string *group,int index,Host *host)

{
  pointer __s2;
  size_t sVar1;
  size_t __n;
  int iVar2;
  pointer psVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  psVar3 = (this->m_hosts).
           super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->m_hosts).
                super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3;
  bVar8 = lVar5 != 0;
  if (bVar8) {
    uVar6 = lVar5 >> 4;
    __s2 = (group->_M_dataplus)._M_p;
    sVar1 = group->_M_string_length;
    iVar4 = 0;
    uVar7 = 1;
    do {
      lVar5 = (long)(psVar3->super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __n = *(size_t *)(lVar5 + 0xa8);
      if ((__n == sVar1) &&
         ((__n == 0 || (iVar2 = bcmp(*(void **)(lVar5 + 0xa0),__s2,__n), iVar2 == 0)))) {
        if (iVar4 == index) {
          std::__cxx11::string::_M_assign((string *)host);
          std::__cxx11::string::_M_assign((string *)&host->user);
          std::__cxx11::string::_M_assign((string *)&host->password);
          std::__cxx11::string::_M_assign((string *)&host->ip);
          host->port = *(uint16_t *)(lVar5 + 0x80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&host->tags,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(lVar5 + 0x88));
          std::__cxx11::string::_M_assign((string *)&host->group);
          return bVar8;
        }
        iVar4 = iVar4 + 1;
      }
      bVar8 = uVar7 < uVar6;
      lVar5 = (-(ulong)(uVar6 == 0) - uVar6) + uVar7;
      uVar7 = uVar7 + 1;
      psVar3 = psVar3 + 1;
    } while (lVar5 != 0);
  }
  return bVar8;
}

Assistant:

bool Config::GetHost(const std::string& group, int index, Host* host) {
    int num = 0;
    for (size_t i = 0; i < m_hosts.size(); i++) {
        if (m_hosts[i]->group == group) {
            if (num == index) {
                *host = *m_hosts[i];
                return true;
            }
            num++;
        }
    }
    return false;
}